

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O1

char * vrna_cut_point_remove(char *string,int *cp)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  char *__s;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  char *__s_00;
  
  *cp = -1;
  if (string == (char *)0x0) {
    __s = (char *)0x0;
  }
  else {
    sVar3 = strlen(string);
    __s = strdup(string);
    pcVar4 = strchr(__s,0x26);
    if (pcVar4 != (char *)0x0) {
      uVar2 = ((int)pcVar4 - (int)__s) + 1;
      uVar6 = 0xffffffff;
      if (uVar2 < (uint)sVar3) {
        uVar6 = uVar2;
      }
      *cp = uVar6;
      __s_00 = pcVar4 + 1;
      pcVar5 = strchr(__s_00,0x26);
      if (pcVar5 != (char *)0x0) {
        vrna_message_error("more than one cut-point in input");
      }
      cVar1 = *pcVar4;
      while (cVar1 != '\0') {
        cVar1 = *__s_00;
        __s_00[-1] = cVar1;
        __s_00 = __s_00 + 1;
      }
    }
  }
  return __s;
}

Assistant:

PUBLIC char *
vrna_cut_point_remove(const char  *string,
                      int         *cp)
{
  char *pos, *copy = NULL;
  unsigned int len;

  *cp = -1;

  if (string) {
    len = strlen(string);
    copy = strdup(string);
    if ((pos = strchr(copy, '&'))) {
      *cp = (int)(pos - copy) + 1;
      if (*cp >= len)
        *cp = -1;

      if (strchr(pos + 1, '&'))
        vrna_message_error("more than one cut-point in input");

      for (; *pos; pos++)
        *pos = *(pos + 1);               /* splice out the & */
    }
  }

  return copy;
}